

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

TupleMake * __thiscall
wasm::Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands)

{
  Module *pMVar1;
  TupleMake *pTVar2;
  
  pMVar1 = this->wasm;
  pTVar2 = (TupleMake *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x158),0x30,8);
  (pTVar2->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = TupleMakeId;
  (pTVar2->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
  (pTVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pTVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pTVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pTVar2->operands).allocator = (MixedArena *)(pMVar1 + 0x158);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pTVar2->operands,
             operands);
  wasm::TupleMake::finalize();
  return pTVar2;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }